

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

Node * hashkey(GCtab *t,cTValue *key)

{
  uint32_t uVar1;
  anon_struct_8_2_f9ee98fb_for_u32 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  aVar2 = key->u32;
  uVar5 = (long)aVar2 >> 0x2f;
  if (uVar5 == 0xfffffffffffffffb) {
    uVar3 = t->hmask & *(uint *)(((ulong)aVar2 & 0x7fffffffffff) + 0xc);
  }
  else {
    if (uVar5 < 0xfffffffffffffff2) {
      uVar1 = (key->field_4).it;
      uVar3 = uVar1 * 2;
      uVar4 = ((key->u32).lo ^ uVar3) - (uVar1 << 0xf | uVar3 >> 0x12);
      uVar3 = ((uVar1 << 0x14 | uVar3 >> 0xd) ^ uVar4) - (uVar4 * 0x2000 | uVar4 >> 0x13);
    }
    else {
      uVar3 = aVar2.hi;
      if (uVar5 + 3 < 2) {
        uVar3 = -((int)uVar3 >> 0xf) - 2;
      }
      else {
        uVar4 = (aVar2.lo ^ uVar3) - (uVar3 << 0xe | uVar3 >> 0x12);
        uVar3 = ((uVar3 << 0x13 | uVar3 >> 0xd) ^ uVar4) - (uVar4 * 0x2000 | uVar4 >> 0x13);
      }
    }
    uVar3 = uVar3 & t->hmask;
  }
  return (Node *)((ulong)uVar3 * 0x18 + (t->node).ptr64);
}

Assistant:

static Node *hashkey(const GCtab *t, cTValue *key)
{
  lj_assertX(!tvisint(key), "attempt to hash integer");
  if (tvisstr(key))
    return hashstr(t, strV(key));
  else if (tvisnum(key))
    return hashnum(t, key);
  else if (tvisbool(key))
    return hashmask(t, boolV(key));
  else
    return hashgcref(t, key->gcr);
  /* Only hash 32 bits of lightuserdata on a 64 bit CPU. Good enough? */
}